

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

size_t rtosc_scan_arg_val(char *src,rtosc_arg_val_t *arg,size_t nargs,char *buffer_for_strings,
                         size_t *bufsize,size_t args_before,int follow_ellipsis)

{
  rtosc_arg_t *prVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar6;
  char cVar7;
  uint8_t uVar8;
  int32_t iVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  __int32_t **pp_Var13;
  ushort **ppuVar14;
  size_t sVar15;
  rtosc_arg_val_t *prVar16;
  rtosc_arg_val_t *prVar17;
  size_t sVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint uVar22;
  long lVar23;
  size_t sVar24;
  bool bVar25;
  ushort uVar26;
  int rd;
  int rd_1;
  int32_t tmp;
  float secfracsf;
  size_t zero;
  rtosc_arg_val_t tmp_2;
  uint8_t *local_118;
  char local_109;
  rtosc_arg_val_t *local_108;
  int local_fc;
  uint8_t *local_f8;
  char *local_f0;
  size_t local_e8;
  rtosc_arg_val_t local_e0;
  undefined1 local_c8 [12];
  undefined2 auStack_bc [2];
  undefined8 local_b8;
  rtosc_arg_val_t local_88;
  size_t local_68;
  ushort **local_60;
  size_t local_58;
  size_t local_50;
  rtosc_arg_val_t local_48;
  byte bVar4;
  byte bVar5;
  
  local_fc = 0;
  sVar18 = nargs - 1;
  bVar6 = *src;
  local_118 = (uint8_t *)src;
  local_108 = arg;
  local_f8 = (uint8_t *)buffer_for_strings;
  local_68 = args_before;
  if (bVar6 < 0x42) {
    if (bVar6 == 0x22) {
      local_118 = (uint8_t *)(src + 1);
      while( true ) {
        while (puVar19 = local_118, *local_118 != '\"') {
          *bufsize = *bufsize - 1;
          uVar8 = *local_118;
          local_118 = local_118 + 1;
          if (uVar8 == '\\') {
            uVar8 = get_escaped_char(*local_118,0);
            *buffer_for_strings = uVar8;
            local_118 = local_118 + 1;
          }
          else {
            *buffer_for_strings = uVar8;
          }
          buffer_for_strings = (char *)((uint8_t *)buffer_for_strings + 1);
        }
        if (local_118[1] != '\\') break;
        local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
        __isoc99_sscanf(local_118,"\"\\ \"%n",local_c8);
        local_118 = puVar19 + (int)local_c8._0_4_;
      }
      *buffer_for_strings = '\0';
      *bufsize = *bufsize - 1;
      (local_108->val).s = (char *)local_f8;
      cVar7 = 's';
      puVar19 = local_118 + 1;
      if (local_118[1] == 'S') {
        *bufsize = *bufsize - 1;
        cVar7 = 'S';
        puVar19 = local_118 + 2;
      }
      local_118 = puVar19;
      local_108->type = cVar7;
    }
    else if (bVar6 == 0x23) {
      arg->type = 'r';
      __isoc99_sscanf(src + 1,"%x",&arg->val);
      local_118 = (uint8_t *)(src + 9);
    }
    else {
      if (bVar6 != 0x27) goto LAB_0010e689;
      arg->type = 'c';
      pcVar11 = src + 1;
      uVar22 = (uint)src[1];
      if (uVar22 == 0x5c) {
        cVar7 = src[3];
        uVar22 = 0x5c;
        if (((long)cVar7 != 0) &&
           (ppuVar14 = __ctype_b_loc(), arg = local_108,
           (*(byte *)((long)*ppuVar14 + (long)cVar7 * 2 + 1) & 0x20) == 0)) {
          pcVar11 = src + 2;
          bVar6 = get_escaped_char(src[2],1);
          uVar22 = (uint)bVar6;
        }
      }
      (arg->val).i = uVar22;
      local_118 = (uint8_t *)(pcVar11 + 2);
    }
  }
  else {
    uVar12 = (ulong)(bVar6 - 0x4d);
    puVar19 = (uint8_t *)src;
    if (bVar6 - 0x4d < 0x28) {
      if ((0x8212000000U >> (uVar12 & 0x3f) & 1) == 0) {
        if (uVar12 == 0) {
          iVar10 = strncmp("MIDI",src,4);
          if (iVar10 == 0) {
            ppuVar14 = __ctype_b_loc();
            if (((long)src[4] == 0x5b) || (((*ppuVar14)[src[4]] & 0x2000) != 0)) {
              arg->type = 'm';
              __isoc99_sscanf(src,"MIDI [ 0x%x 0x%x 0x%x 0x%x ]%n",local_c8,local_c8 + 4,
                              local_c8 + 8,auStack_bc,&local_fc);
              local_118 = (uint8_t *)(src + local_fc);
              uVar26 = auStack_bc[0] & 0xff;
              bVar6 = ((local_c8._0_8_ & 0xff) != 0) * ((local_c8._0_2_ & 0xff) < 0x100) *
                      (char)local_c8._0_8_ - (0xff < (local_c8._0_2_ & 0xff));
              bVar3 = ((local_c8._0_8_ & 0xff00000000) != 0) * ((local_c8._4_2_ & 0xff) < 0x100) *
                      SUB81(local_c8._0_8_,4) - (0xff < (local_c8._4_2_ & 0xff));
              bVar4 = ((local_c8._8_4_ & 0xff) != 0) * ((local_c8._8_2_ & 0xff) < 0x100) *
                      (uint8_t)local_c8._8_4_ - (0xff < (local_c8._8_2_ & 0xff));
              bVar5 = (uVar26 != 0) * (uVar26 < 0x100) * (char)auStack_bc[0] - (0xff < uVar26);
              (arg->val).i = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                      CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                               (0xff < bVar4),
                                               CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                        (0xff < bVar3),
                                                        (bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                        (0xff < bVar6))));
              goto LAB_0010ea00;
            }
          }
          goto LAB_0010e77b;
        }
        if (uVar12 != 0xe) goto LAB_0010e4e3;
        local_60 = __ctype_b_loc();
        do {
          uVar12 = (ulong)(char)puVar19[1];
          puVar19 = puVar19 + 1;
        } while ((*(byte *)((long)*local_60 + uVar12 * 2 + 1) & 0x20) != 0);
        prVar16 = arg + 1;
        local_109 = ' ';
        sVar24 = 0;
        sVar15 = 0;
        puVar21 = local_f8;
        local_118 = puVar19;
        local_f0 = src;
        while ((prVar17 = local_108, (char)uVar12 != ']' && ((uVar12 & 0xff) != 0))) {
          sVar2 = *bufsize;
          local_f8 = puVar21;
          local_e8 = sVar24;
          local_58 = sVar15;
          sVar15 = rtosc_scan_arg_val((char *)puVar19,prVar16,sVar18,(char *)puVar21,bufsize,sVar15,
                                      1);
          cVar7 = prVar16->type;
          if (cVar7 == '-') {
            iVar9 = rtosc_av_rep_has_delta(prVar16);
            prVar17 = prVar16 + 2;
            if (iVar9 == 0) {
              prVar17 = prVar16 + 1;
            }
            cVar7 = prVar17->type;
          }
          local_109 = cVar7;
          iVar10 = next_arg_offset(prVar16);
          prVar16 = prVar16 + iVar10;
          puVar19 = puVar19 + (sVar15 - 1);
          do {
            uVar12 = (ulong)(char)puVar19[1];
            puVar19 = puVar19 + 1;
          } while ((*(byte *)((long)*local_60 + uVar12 * 2 + 1) & 0x20) != 0);
          sVar18 = sVar18 - (long)iVar10;
          puVar21 = local_f8 + (sVar2 - *bufsize);
          sVar15 = local_58 + 1;
          sVar24 = (size_t)(uint)(iVar10 + (int)local_e8);
        }
        local_118 = puVar19 + 1;
        local_108->type = 'a';
        rtosc_av_arr_type_set(local_108,local_109);
        rtosc_av_arr_len_set(prVar17,(int32_t)sVar24);
        src = local_f0;
      }
      else {
        pcVar11 = skip_word("immediately",(char **)&local_118);
        if ((pcVar11 == (char *)0x0) &&
           (pcVar11 = skip_word("now",(char **)&local_118), pcVar11 == (char *)0x0)) {
          pcVar11 = skip_word("true",(char **)&local_118);
          if ((pcVar11 == (char *)0x0) &&
             (pcVar11 = skip_word("false",(char **)&local_118), pcVar11 == (char *)0x0)) {
            pcVar11 = skip_word("nil",(char **)&local_118);
            if ((pcVar11 == (char *)0x0) &&
               (pcVar11 = skip_word("inf",(char **)&local_118), puVar19 = local_118,
               pcVar11 == (char *)0x0)) goto LAB_0010e77b;
            pp_Var13 = __ctype_toupper_loc();
            arg->type = (char)(*pp_Var13)[bVar6];
          }
          else {
            pp_Var13 = __ctype_toupper_loc();
            arg->type = (char)(*pp_Var13)[bVar6];
            (arg->val).T = local_118[-2] == 'u';
          }
        }
        else {
          rtosc_arg_val_immediatelly(arg);
        }
      }
    }
    else {
LAB_0010e4e3:
      if (bVar6 == 0x42) {
        arg->type = 'b';
        __isoc99_sscanf(src,"BLOB [ %i %n",&arg->val,&local_fc);
        prVar16 = local_108;
        if ((long)local_fc == 0) {
LAB_0010e77b:
          local_118 = (uint8_t *)parse_identifier((char *)puVar19,arg,(char *)local_f8,bufsize);
        }
        else {
          *bufsize = *bufsize - (long)(arg->val).i;
          pcVar11 = src + local_fc;
          (arg->val).b.data = local_f8;
          local_f0 = src;
          if (0 < (arg->val).i) {
            lVar23 = 0;
            do {
              __isoc99_sscanf(pcVar11,"0x%x %n",local_c8,&local_e0);
              (prVar16->val).b.data[lVar23] = local_c8[0];
              pcVar11 = pcVar11 + (int)local_e0._0_4_;
              lVar23 = lVar23 + 1;
            } while (lVar23 < (prVar16->val).i);
          }
          local_118 = (uint8_t *)(pcVar11 + 1);
          src = local_f0;
        }
      }
      else {
LAB_0010e689:
        local_e8 = sVar18;
        iVar10 = is_range_multiplier(src);
        if (iVar10 == 0) {
          if ((bVar6 == 0x5f) ||
             (ppuVar14 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar14 + (long)(char)bVar6 * 2 + 1) & 4) != 0)) {
            local_108->type = 'S';
            (local_108->val).s = (char *)local_f8;
            puVar19 = (uint8_t *)src;
            puVar21 = local_f8;
            while ((uVar8 = *puVar19, (long)(char)uVar8 == 0x5f ||
                   (ppuVar14 = __ctype_b_loc(), ((*ppuVar14)[(char)uVar8] & 8) != 0))) {
              *bufsize = *bufsize - 1;
              *puVar21 = *puVar19;
              puVar21 = puVar21 + 1;
              puVar19 = puVar19 + 1;
            }
            *bufsize = *bufsize - 1;
            *puVar21 = '\0';
            local_118 = puVar19;
          }
          else if ((((bVar6 == 0) || (src[1] == '\0')) || (src[2] == '\0')) ||
                  ((src[3] == '\0' || (src[4] != '-')))) {
            bVar25 = false;
            local_108->type = '\0';
            local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
            prVar1 = &local_108->val;
            puVar19 = (uint8_t *)src;
            local_f0 = src;
            do {
              local_fc = 0;
              pcVar11 = scanf_fmtstr((char *)puVar19,&local_88.type);
              fast_strcpy(local_c8,pcVar11,0x10);
              local_c8[1] = 0x25;
              if (local_108->type == '\0') {
                local_108->type = local_88.type;
              }
              if (((byte)local_88.type - 100 < 6) &&
                 ((0x35U >> ((byte)local_88.type - 100 & 0x1f) & 1) != 0)) {
                __isoc99_sscanf(puVar19,local_c8 + 1,prVar1,&local_fc);
              }
              puVar21 = puVar19 + local_fc;
              local_118 = puVar21;
              if (bVar25) {
                local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
                __isoc99_sscanf(puVar21," )%n",&local_e0);
                local_118 = puVar21 + (int)local_e0._0_4_;
                src = local_f0;
                break;
              }
              uVar8 = *puVar21;
              if (uVar8 != '\0') {
                puVar19 = puVar19 + local_fc;
                do {
                  puVar19 = puVar19 + 1;
                  iVar10 = isspace((int)(char)uVar8);
                  if (iVar10 == 0) {
                    if (uVar8 == '(') {
                      uVar8 = *puVar19;
                      puVar21 = puVar19;
                      while ((uVar8 != '\0' && (iVar10 = isspace((int)(char)uVar8), iVar10 != 0))) {
                        uVar8 = puVar21[1];
                        puVar21 = puVar21 + 1;
                      }
                      bVar25 = true;
                      local_118 = puVar21;
                    }
                    break;
                  }
                  uVar8 = *puVar19;
                } while (uVar8 != '\0');
              }
              puVar19 = puVar21;
              src = local_f0;
            } while (bVar25);
          }
          else {
            (local_108->val).d = 0.0;
            local_c8._8_4_ = 0;
            local_c8._0_8_ = 0;
            local_f0 = src;
            __isoc99_sscanf(src,"%4d-%2d-%2d%n",(long)&local_b8 + 4,&local_b8,auStack_bc);
            puVar19 = (uint8_t *)(src + local_fc);
            local_fc = 0;
            local_118 = puVar19;
            __isoc99_sscanf(puVar19," %2d:%2d%n",local_c8 + 8,local_c8 + 4,&local_fc);
            if ((long)local_fc != 0) {
              puVar19 = puVar19 + local_fc;
              local_118 = puVar19;
            }
            local_fc = 0;
            __isoc99_sscanf(puVar19,":%2d%n",local_c8,&local_fc);
            if ((long)local_fc != 0) {
              puVar19 = puVar19 + local_fc;
              local_118 = puVar19;
            }
            local_e0._0_8_ = (ulong)(uint)local_e0._4_4_ << 0x20;
            __isoc99_sscanf(puVar19,"%*f (%n",&local_e0);
            puVar19 = puVar19 + (int)local_e0._0_4_;
            local_118 = puVar19;
            if ((long)(int)local_e0._0_4_ == 0) {
              if (*puVar19 == '.') {
                __isoc99_sscanf(puVar19,"%f%n",&local_88,&local_fc);
                local_118 = puVar19 + local_fc;
                local_e0._0_8_ = rtosc_float2secfracs((float)local_88._0_4_);
              }
              else {
                local_e0._0_8_ = 0;
              }
            }
            else {
              __isoc99_sscanf(puVar19," ... + 0x%8lxp-32 s )%n",&local_e0,&local_fc);
              local_118 = puVar19 + local_fc;
            }
            src = local_f0;
            local_b8 = CONCAT44((int)((ulong)local_b8 >> 0x20) + -0x76c,(int)local_b8 + -1);
            rtosc_arg_val_from_params(local_108,(tm_conflict *)local_c8,local_e0._0_8_);
          }
        }
        else {
          local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
          __isoc99_sscanf(src,"%dx%n",local_c8,&local_e0);
          prVar16 = local_108;
          lVar23 = (long)(int)local_e0._0_4_;
          local_108->type = '-';
          rtosc_av_rep_num_set(local_108,local_c8._0_4_);
          rtosc_av_rep_has_delta_set(prVar16,0);
          sVar18 = rtosc_scan_arg_val(src + lVar23,prVar16 + 1,local_e8,(char *)local_f8,bufsize,0,0
                                     );
          iVar10 = next_arg_offset(prVar16 + 1);
          local_108 = prVar16 + (long)iVar10 + 1;
          local_118 = (uint8_t *)(src + lVar23 + sVar18);
        }
      }
    }
  }
LAB_0010ea00:
  puVar19 = local_118;
  ppuVar14 = __ctype_b_loc();
  sVar18 = local_68;
  puVar21 = puVar19 + 1;
  do {
    puVar20 = puVar21;
    puVar21 = puVar20 + 1;
  } while ((*(byte *)((long)*ppuVar14 + (long)(char)puVar20[-1] * 2 + 1) & 0x20) != 0);
  local_118 = puVar19;
  if ((((follow_ellipsis == 0) || (puVar20[-1] != '.')) || (*puVar20 != '.')) || (*puVar21 != '.'))
  goto LAB_0010ebd7;
  local_88.val.b.data = (local_108->val).b.data;
  local_88.type = local_108->type;
  local_88._1_7_ = *(undefined7 *)&local_108->field_0x1;
  local_88.val.d = (local_108->val).d;
  do {
    uVar8 = puVar21[1];
    puVar21 = puVar21 + 1;
  } while ((*(byte *)((long)*ppuVar14 + (long)(char)uVar8 * 2 + 1) & 0x20) != 0);
  local_118 = puVar21;
  if (uVar8 != ']') {
    sVar15 = rtosc_scan_arg_val((char *)puVar21,&local_e0,1,(char *)0x0,&local_50,0,0);
    local_118 = puVar21 + sVar15;
  }
  prVar16 = local_108;
  if ((sVar18 < 3) || (local_108[-3].type != '-')) {
LAB_0010eb14:
    prVar16 = prVar16 + -1;
  }
  else {
    prVar17 = local_108 + -3;
    iVar9 = rtosc_av_rep_has_delta(prVar17);
    if (iVar9 == 0) goto LAB_0010eb14;
    iVar9 = rtosc_av_rep_num(prVar17);
    prVar16 = rtosc_arg_val_range_arg(prVar17,iVar9 + -1,&local_48);
  }
  bVar25 = true;
  if ((local_88.type != '-' && sVar18 != 0) &&
     (((cVar7 = prVar16->type, cVar7 == local_88.type || ((local_88.type == 'F' && (cVar7 == 'T'))))
      || ((local_88.type == 'T' && (cVar7 == 'F')))))) {
    iVar10 = rtosc_arg_vals_cmp_single(prVar16,&local_88,(rtosc_cmp_options *)0x0);
    bVar25 = iVar10 == 0;
  }
  if (uVar8 == ']') {
    uVar22 = 0;
    iVar9 = 0;
    if (bVar25 == false) goto LAB_0010eb74;
  }
  else {
LAB_0010eb74:
    prVar17 = &local_e0;
    if (uVar8 == ']') {
      prVar17 = (rtosc_arg_val_t *)0x0;
    }
    iVar9 = delta_from_arg_vals(prVar16,&local_88,prVar17,(rtosc_arg_val_t *)local_c8,(uint)bVar25);
    uVar22 = (uint)(iVar9 != -1 || uVar8 != ']');
  }
  insert_arg_range(local_108,iVar9,&local_88,uVar22,(rtosc_arg_val_t *)local_c8,1,1);
LAB_0010ebd7:
  return (long)local_118 - (long)src;
}

Assistant:

size_t rtosc_scan_arg_val(const char* src,
                          rtosc_arg_val_t *arg, size_t nargs,
                          char* buffer_for_strings, size_t* bufsize,
                          size_t args_before, int follow_ellipsis)
{
    int rd = 0;
    const char* start = src;
    assert(nargs);
    --nargs;
    switch(*src)
    {
        case 't':
        case 'f':
        case 'n':
        case 'i':
        {
            const char* src_backup = src;
            // timestamps "immediately" or "now"?
            if(skip_word("immediately", &src) || skip_word("now", &src))
            {
                rtosc_arg_val_immediatelly(arg);
            }
            else if(skip_word("true", &src)  ||
                    skip_word("false", &src) )
            {
                arg->type = toupper(*src_backup);
                arg->val.T = (src[-2] == 'u');
            }
            else if(skip_word("nil", &src)   ||
                    skip_word("inf", &src))
            {
                arg->type = toupper(*src_backup);
            }
            else
            {
                // no reserved keyword => identifier
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            }
            break;
        }
        case '#':
        {
            arg->type = 'r';
            sscanf(++src, "%x", &arg->val.i);
            src+=8;
            break;
        }
        case '\'':
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\'<isspace> => mistyped backslash
            arg->type = 'c';
            if(*++src == '\\')
            {
                if(src[2] && !isspace(src[2])) // escaped and 4 chars
                    arg->val.i = get_escaped_char(*++src, true);
                else // escaped, but only 3 chars: type 4
                    arg->val.i = '\\';
            }
            else // non-escaped
                arg->val.i = *src;
            src+=2;
            break;
        case '"':
        {
            ++src; // skip obligatory '"'
            char* dest = buffer_for_strings;
            bool cont;
            do
            {
                while(*src != '"')
                {
                    (*bufsize)--;
                    assert(*bufsize);
                    if(*src == '\\') {
                        *dest++ = get_escaped_char(*++src, false);
                        ++src;
                    }
                    else
                        *dest++ = *src++;
                }
                if(src[1] == '\\')
                {
                    skip_fmt(&src, "\"\\ \"%n");
                    cont = true;
                }
                else
                    cont = false;
            } while (cont);
            *dest = 0;
            ++src; // skip final '"'
            (*bufsize)--;
            arg->val.s = buffer_for_strings;
            if(*src == 'S')
            {
                ++src;
                (*bufsize)--;
                arg->type = 'S';
            }
            else
                arg->type = 's';
            break;
        }
        case 'M':
        {
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                arg->type = 'm';
                int32_t tmp[4];
                sscanf(src, "MIDI [ 0x%"PRIx32" 0x%"PRIx32
                                  " 0x%"PRIx32" 0x%"PRIx32" ]%n",
                       tmp, tmp + 1, tmp + 2, tmp + 3, &rd); src+=rd;
                for(size_t i = 0; i < 4; ++i)
                    arg->val.m[i] = tmp[i]; // copy to 8 bit array
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        case '[':
        {
            while(isspace(*++src));
            int32_t num_read = 0;

            rtosc_arg_val_t* start_arg = arg++;

            size_t last_bufsize;

            char arrtype = ' ';
            for(size_t i = 0; src && *src && *src != ']'; ++i)
            {
                last_bufsize = *bufsize;

                src += rtosc_scan_arg_val(src, arg, nargs,
                                          buffer_for_strings, bufsize, i, 1);
                arrtype = arg->type;
                if(arrtype == '-')
                    arrtype = rtosc_av_rep_has_delta(arg) ? arg[2].type : arg[1].type;

                size_t args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                num_read += args_scanned;

                for( ; isspace(*src); ++src) ;

                buffer_for_strings += (last_bufsize - *bufsize);
                // TODO: allow comments in arrays, blobs, midi?
            }

            ++src; // ']'
            start_arg->type = 'a';
            rtosc_av_arr_type_set(start_arg, arrtype);
            rtosc_av_arr_len_set(start_arg, num_read);

            arg = start_arg; // invariant: arg is back at the start
            break;
        }
        case 'B': // blob
        {
            arg->type = 'b';
            sscanf(src, "BLOB [ %"PRIi32" %n", &arg->val.b.len, &rd);
            if(rd)
            {
                src +=rd;

                assert(*bufsize >= (size_t)arg->val.b.len);
                *bufsize -= (size_t)arg->val.b.len;
                arg->val.b.data = (uint8_t*)buffer_for_strings;
                for(int32_t i = 0; i < arg->val.b.len; ++i)
                {
                    int32_t tmp;
                    int rd;
                    sscanf(src, "0x%x %n", &tmp, &rd);
                    arg->val.b.data[i] = tmp;
                    src+=rd;
                }

                ++src; // skip ']'
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        default:
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                // collect information for range_arg
                int multiplier, rd = 0;
                sscanf(src, "%dx%n", &multiplier, &rd);
                src += rd;
                arg->type = '-';
                rtosc_av_rep_num_set(arg, multiplier);
                rtosc_av_rep_has_delta_set(arg, 0);

                ++arg;
                // read value-arg
                size_t old_bufsize = *bufsize;
                size_t tmp = rtosc_scan_arg_val(src, arg, nargs,
                                                buffer_for_strings, bufsize,
                                                0, 0);
                buffer_for_strings += old_bufsize - *bufsize;
                int args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                src += tmp;
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                arg->type = 'S';
                arg->val.s = buffer_for_strings;
                for(; *src == '_' || isalnum(*src); ++src)
                {
                    assert(*bufsize);
                    (*bufsize)--;
                    *buffer_for_strings = *src;
                    ++buffer_for_strings;
                }
                assert(*bufsize);
                (*bufsize)--;
                *buffer_for_strings = 0;
                ++buffer_for_strings;
            }
            // "YYYY-" => it's a date
            else if(src[0] && src[1] && src[2] && src[3] && src[4] == '-')
            {
                arg->val.t = 0;

                struct tm m_tm;
                m_tm.tm_hour = 0;
                m_tm.tm_min = 0;
                m_tm.tm_sec = 0;
                sscanf(src, "%4d-%2d-%2d%n",
                       &m_tm.tm_year, &m_tm.tm_mon, &m_tm.tm_mday, &rd);
                src+=rd;
                float secfracsf;

                rd = 0;
                sscanf(src, " %2d:%2d%n", &m_tm.tm_hour, &m_tm.tm_min, &rd);
                if(rd)
                 src+=rd;

                rd = 0;
                sscanf(src, ":%2d%n", &m_tm.tm_sec, &rd);
                if(rd)
                 src+=rd;

                uint64_t secfracs;

                // lossless format is appended in parentheses?
                //  => take it directly from there
                if(skip_fmt(&src, "%*f (%n"))
                {
                    sscanf(src, " ... + 0x%8"PRIx64"p-32 s )%n",
                           &secfracs, &rd);
                    src += rd;
                }
                // float number, but not lossless?
                //  => convert it to fractions of seconds
                else if(*src == '.')
                {
                    sscanf(src, "%f%n", &secfracsf, &rd);
                    src += rd;

                    secfracs = rtosc_float2secfracs(secfracsf);
                }
                else
                {
                    // no fractional / floating seconds part
                    secfracs = 0;
                }

                // posix adjustments
                m_tm.tm_year -= 1900;
                --m_tm.tm_mon;
                rtosc_arg_val_from_params(arg, &m_tm, secfracs);
            }
            else
            {
                char bytes16[16];
                char type = arg->type = 0;

                bool repeat_once = false;
                do
                {
                    rd = 0;

                    const char *fmtstr = scanf_fmtstr_scan(src, bytes16,
                                                           &type);
                    if(!arg->type) // the first occurrence determines the type
                     arg->type = type;

                    switch(type)
                    {
                        case 'h':
                            sscanf(src, fmtstr, &arg->val.h, &rd); break;
                        case 'i':
                            sscanf(src, fmtstr, &arg->val.i, &rd); break;
                        case 'f':
                            sscanf(src, fmtstr, &arg->val.f, &rd); break;
                        case 'd':
                            sscanf(src, fmtstr, &arg->val.d, &rd); break;
                    }
                    src += rd;

                    if(repeat_once)
                    {
                        // we have read the lossless part. skip spaces and ')'
                        skip_fmt(&src, " )%n");
                        repeat_once = false;
                    }
                    else
                    {
                        // is a lossless part appended in parentheses?
                        const char* after_num = src;
                        skip_while(&after_num, isspace);
                        if(*after_num == '(') {
                            ++after_num;
                            skip_while(&after_num, isspace);
                            src = after_num;
                            repeat_once = true;
                        }
                    }
                } while(repeat_once);
            } // date vs integer
        // case ident
    } // switch

    // is the argument being followed by an ellipsis?
    const char* src2 = src;
    for(; isspace(*src2); ++src2) ;

    if(follow_ellipsis && !strncmp(src2, "...", 3))
    {
        src = src2;
        rtosc_arg_val_t delta, rhs;
        size_t zero;

        // lhsarg has already been read
        rtosc_arg_val_t lhsarg = *arg;

        // skip ellipsis and read rhs
        src += 2;
        while(isspace(*++src)) ;

        int infinite_range = (*src == ']');

        if(!infinite_range)
            src += rtosc_scan_arg_val(src, &rhs, 1, NULL, &zero, 0, 0);

        /*
            these shall be conforming to delta_from_arg_vals,
            i.e. if ranges,    the last elements of the ranges
                 if no ranges, the elements themselves
         */
        // find llhs position
        rtosc_arg_val_t tmp;
        // argument "-2" could be a delta arg
        rtosc_arg_val_t* llhsarg = (args_before > 2 &&
                                    arg[-3].type == '-' &&
                                    rtosc_av_rep_has_delta(arg-3))
                      // -2 is a delta arg (following a range arg)?
                      ? rtosc_arg_val_range_arg(arg-3, rtosc_av_rep_num(arg-3)-1,
                                                &tmp)
                      : (args_before > 1 && arg[-2].type == '-')
                      // -2 is a range arg (without delta)?
                      ? arg-1
                      : arg-1; // normal case

        bool llhsarg_is_useless =
            (args_before < 1 ||
            lhsarg.type == '-' || !types_match(llhsarg->type, lhsarg.type)
            /* this includes llhsarg == '-' */
            || !rtosc_arg_vals_cmp_single(llhsarg, &lhsarg, NULL));


        bool has_delta = true;
        int32_t num;
        if(infinite_range && llhsarg_is_useless)
        {
            has_delta = false;
            num = 0; // suppress compiler warnings
        }
        else
        {
            num = delta_from_arg_vals(llhsarg, &lhsarg,
                                      infinite_range ? NULL : &rhs,
                                      &delta, llhsarg_is_useless);

            assert(infinite_range || num > 0);
            if(infinite_range && num == -1)
            {
                has_delta = false;
            }
        }

        insert_arg_range(arg, num, &lhsarg, has_delta, &delta, true, true);
    }

    return (size_t)(src-start);
}